

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TokenList *args_4;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_3;
  Token *args_2;
  ConstraintDeclarationSyntax *pCVar1;
  Token TVar2;
  ConstraintBlockSyntax *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_00000068;
  TokenList *in_stack_00000070;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ConstraintBlockSyntax *in_stack_ffffffffffffffb0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  args_4 = deepClone(in_stack_00000070,in_stack_00000068);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  args_3 = deepClone<slang::syntax::ClassSpecifierSyntax>
                     ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_stack_00000060,
                      in_stack_00000058);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa531c4);
  args_2 = (Token *)deepClone<slang::syntax::NameSyntax>
                              ((NameSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  not_null<slang::syntax::ConstraintBlockSyntax_*>::operator*
            ((not_null<slang::syntax::ConstraintBlockSyntax_*> *)0xa531e7);
  deepClone<slang::syntax::ConstraintBlockSyntax>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>&,slang::syntax::NameSyntax&,slang::syntax::ConstraintBlockSyntax&>
                     ((BumpAllocator *)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      args_2,args_3,(NameSyntax *)args_4,unaff_retaddr);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConstraintDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConstraintDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.qualifiers, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.specifiers, alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        *deepClone<ConstraintBlockSyntax>(*node.block, alloc)
    );
}